

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cc
# Opt level: O2

int main(void)

{
  RandomDataProvider *pRVar1;
  long lVar2;
  RandomDataProvider *pRVar3;
  long r1;
  long r2;
  uchar buf [4];
  BogusRandomDataProvider brdp;
  SecureRandomDataProvider srdp;
  InsecureRandomDataProvider irdp;
  
  pRVar1 = QUtil::getRandomDataProvider();
  lVar2 = QUtil::random();
  r1 = lVar2;
  r2 = QUtil::random();
  if (lVar2 == r2) {
    std::operator<<((ostream *)&std::cout,"fail: two randoms were the same\n");
  }
  InsecureRandomDataProvider::InsecureRandomDataProvider(&irdp);
  InsecureRandomDataProvider::provideRandomData(&irdp,(uchar *)&r1,4);
  InsecureRandomDataProvider::provideRandomData(&irdp,(uchar *)&r2,4);
  if (r1 == r2) {
    std::operator<<((ostream *)&std::cout,"fail: two insecure randoms were the same\n");
  }
  srdp.super_RandomDataProvider._vptr_RandomDataProvider =
       (RandomDataProvider)&PTR__RandomDataProvider_002b0e30;
  SecureRandomDataProvider::provideRandomData(&srdp,(uchar *)&r1,4);
  SecureRandomDataProvider::provideRandomData(&srdp,(uchar *)&r2,4);
  if (r1 == r2) {
    std::operator<<((ostream *)&std::cout,"fail: two secure randoms were the same\n");
  }
  brdp.super_RandomDataProvider._vptr_RandomDataProvider =
       (RandomDataProvider)&PTR__RandomDataProvider_002abad0;
  QUtil::setRandomDataProvider(&brdp.super_RandomDataProvider);
  pRVar3 = QUtil::getRandomDataProvider();
  if (pRVar3 != &brdp.super_RandomDataProvider) {
    std::operator<<((ostream *)&std::cout,
                    "fail: getRandomDataProvider didn\'t return our provider\n");
  }
  r1 = QUtil::random();
  r2 = QUtil::random();
  if (r1 != r2) {
    std::operator<<((ostream *)&std::cout,"fail: two bogus randoms were different\n");
  }
  QUtil::initializeWithRandomBytes(buf,4);
  if (buf != (uchar  [4])0x3020100) {
    std::operator<<((ostream *)&std::cout,"fail: bogus random didn\'t provide correct bytes\n");
  }
  QUtil::setRandomDataProvider((RandomDataProvider *)0x0);
  pRVar3 = QUtil::getRandomDataProvider();
  if (pRVar3 != pRVar1) {
    std::operator<<((ostream *)&std::cout,
                    "fail: passing null to setRandomDataProvider didn\'t reset the random data provider\n"
                   );
  }
  std::operator<<((ostream *)&std::cout,"random: end of tests\n");
  return 0;
}

Assistant:

int
main()
{
    RandomDataProvider* orig_rdp = QUtil::getRandomDataProvider();
    long r1 = QUtil::random();
    long r2 = QUtil::random();
    if (r1 == r2) {
        std::cout << "fail: two randoms were the same\n";
    }
    InsecureRandomDataProvider irdp;
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two insecure randoms were the same\n";
    }
#ifndef SKIP_OS_SECURE_RANDOM
    SecureRandomDataProvider srdp;
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two secure randoms were the same\n";
    }
#endif
    BogusRandomDataProvider brdp;
    QUtil::setRandomDataProvider(&brdp);
    if (QUtil::getRandomDataProvider() != &brdp) {
        std::cout << "fail: getRandomDataProvider didn't"
                     " return our provider\n";
    }
    r1 = QUtil::random();
    r2 = QUtil::random();
    if (r1 != r2) {
        std::cout << "fail: two bogus randoms were different\n";
    }
    unsigned char buf[4];
    QUtil::initializeWithRandomBytes(buf, 4);
    if (!((buf[0] == 0) && (buf[1] == 1) && (buf[2] == 2) && (buf[3] == 3))) {
        std::cout << "fail: bogus random didn't provide correct bytes\n";
    }
    QUtil::setRandomDataProvider(nullptr);
    if (QUtil::getRandomDataProvider() != orig_rdp) {
        std::cout << "fail: passing null to setRandomDataProvider "
                     "didn't reset the random data provider\n";
    }
    std::cout << "random: end of tests\n";
    return 0;
}